

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O2

bool loadPatchBuffer(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  
  fwrite("Loading {Patch-Vertex-Buffer}\n",0x1e,1,_stdout);
  fflush(_stdout);
  GVar1 = (*glad_glIsBuffer)(g_gl.buffers[6]);
  if (GVar1 != '\0') {
    (*glad_glDeleteBuffers)(1,g_gl.buffers + 6);
  }
  (*glad_glGenBuffers)(1,g_gl.buffers + 6);
  (*glad_glBindBuffer)(0x8892,g_gl.buffers[6]);
  (*glad_glBufferData)(0x8892,0x100,&g_patch,0x88e4);
  (*glad_glBindBuffer)(0x8892,0);
  (*glad_glBindBufferBase)(0x90d2,6,g_gl.buffers[6]);
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadPatchBuffer()
{
    LOG("Loading {Patch-Vertex-Buffer}\n");
    if (glIsBuffer(g_gl.buffers[BUFFER_PATCH]))
        glDeleteBuffers(1, &g_gl.buffers[BUFFER_PATCH]);
    glGenBuffers(1, &g_gl.buffers[BUFFER_PATCH]);
    glBindBuffer(GL_ARRAY_BUFFER, g_gl.buffers[BUFFER_PATCH]);
    glBufferData(GL_ARRAY_BUFFER,
                 sizeof(g_patch.vertices),
                 (const void*)g_patch.vertices,
                 GL_STATIC_DRAW);
    glBindBuffer(GL_ARRAY_BUFFER, 0);
    glBindBufferBase(GL_SHADER_STORAGE_BUFFER,
                     BUFFER_PATCH,
                     g_gl.buffers[BUFFER_PATCH]);

    return (glGetError() == GL_NO_ERROR);
}